

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

void __thiscall CVmConsoleMain::flush_all(CVmConsoleMain *this,vm_nl_type nl)

{
  undefined4 in_ESI;
  undefined8 in_RDI;
  vm_nl_type nl_00;
  CVmBannerManager *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff0;
  
  nl_00 = (vm_nl_type)((ulong)in_RDI >> 0x20);
  CVmConsole::flush((CVmConsole *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),nl_00);
  CVmBannerManager::flush_all(unaff_retaddr,nl_00);
  return;
}

Assistant:

void CVmConsoleMain::flush_all(VMG_ vm_nl_type nl)
{
    /* flush our primary console */
    flush(vmg_ nl);

    /* 
     *   Flush each banner we're controlling.  Note that we explicitly flush
     *   the banners with newline mode 'NONE', regardless of the newline mode
     *   passed in by the caller: the caller's mode is for the primary
     *   console, but for the banners we just want to make sure they're
     *   flushed out normally, since whatever we're doing in the primary
     *   console that requires flushing doesn't concern the banners. 
     */
    banner_manager_->flush_all(vmg_ VM_NL_NONE);
}